

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getShaderFlagStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkShaderStageFlagBits shader,
          bool isDescription)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream desc;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  iVar1 = (int)this;
  pcVar3 = "unknown shader stage!";
  switch(iVar1) {
  case 1:
    pcVar2 = "vertex stage";
    pcVar3 = "vertex_stage";
    break;
  case 2:
    pcVar2 = "tessellation control stage";
    pcVar3 = "tessellation_control_stage";
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_004e4d45_caseD_3;
  case 4:
    pcVar2 = "tessellation evaluation stage";
    pcVar3 = "tessellation_evaluation_stage";
    break;
  case 8:
    pcVar2 = "geometry stage";
    pcVar3 = "geometry_stage";
    break;
  default:
    if (iVar1 == 0x10) {
      pcVar2 = "fragment stage";
      pcVar3 = "fragment_stage";
    }
    else {
      if (iVar1 != 0x20) goto switchD_004e4d45_caseD_3;
      pcVar2 = "compute stage";
      pcVar3 = "compute_stage";
    }
  }
  if ((char)shader != '\0') {
    pcVar3 = pcVar2;
  }
switchD_004e4d45_caseD_3:
  std::operator<<((ostream *)local_190,pcVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderFlagStr (const VkShaderStageFlagBits shader,
							  bool                        isDescription)
{
	std::ostringstream desc;
	switch(shader)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:
		{
			desc << ((isDescription) ? "vertex stage" : "vertex_stage");
			break;
		}
		case VK_SHADER_STAGE_FRAGMENT_BIT:
		{
			desc << ((isDescription) ? "fragment stage" : "fragment_stage");
			break;
		}
		case VK_SHADER_STAGE_GEOMETRY_BIT:
		{
			desc << ((isDescription) ? "geometry stage" : "geometry_stage");
			break;
		}
		case VK_SHADER_STAGE_COMPUTE_BIT:
		{
			desc << ((isDescription) ? "compute stage" : "compute_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
		{
			desc << ((isDescription) ? "tessellation control stage" : "tessellation_control_stage");
			break;
		}
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
		{
			desc << ((isDescription) ? "tessellation evaluation stage" : "tessellation_evaluation_stage");
			break;
		}
	  default:
		desc << "unknown shader stage!";
		DE_FATAL("Unknown shader Stage!");
		break;
	};

	return desc.str();
}